

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch_amalgamated.cpp
# Opt level: O2

ParserResult *
Catch::Clara::Detail::convertInto(ParserResult *__return_storage_ptr__,string *source,bool *target)

{
  bool bVar1;
  bool bVar2;
  string srcLC;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  toLower(&srcLC,source);
  bVar1 = std::operator==(&srcLC,"y");
  bVar2 = true;
  if (!bVar1) {
    bVar1 = std::operator==(&srcLC,"1");
    if (!bVar1) {
      bVar1 = std::operator==(&srcLC,"true");
      if (!bVar1) {
        bVar1 = std::operator==(&srcLC,"yes");
        if (!bVar1) {
          bVar1 = std::operator==(&srcLC,"on");
          if (!bVar1) {
            bVar1 = std::operator==(&srcLC,"n");
            if (!bVar1) {
              bVar1 = std::operator==(&srcLC,"0");
              if (!bVar1) {
                bVar1 = std::operator==(&srcLC,"false");
                if (!bVar1) {
                  bVar1 = std::operator==(&srcLC,"no");
                  if (!bVar1) {
                    bVar1 = std::operator==(&srcLC,"off");
                    if (!bVar1) {
                      std::operator+(&local_68,"Expected a boolean value but did not recognise: \'",
                                     source);
                      std::operator+(&local_48,&local_68,'\'');
                      BasicResult<Catch::Clara::ParseResultType>::runtimeError
                                (__return_storage_ptr__,&local_48);
                      std::__cxx11::string::~string((string *)&local_48);
                      std::__cxx11::string::~string((string *)&local_68);
                      goto LAB_00151fe6;
                    }
                  }
                }
              }
            }
            bVar2 = false;
          }
        }
      }
    }
  }
  *target = bVar2;
  *(undefined8 *)
   &(__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
    m_type = 0;
  (__return_storage_ptr__->super_ResultValueBase<Catch::Clara::ParseResultType>).super_ResultBase.
  _vptr_ResultBase = (_func_int **)&PTR__BasicResult_002f3d40;
  (__return_storage_ptr__->m_errorMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->m_errorMessage).field_2;
  (__return_storage_ptr__->m_errorMessage)._M_string_length = 0;
  (__return_storage_ptr__->m_errorMessage).field_2._M_local_buf[0] = '\0';
LAB_00151fe6:
  std::__cxx11::string::~string((string *)&srcLC);
  return __return_storage_ptr__;
}

Assistant:

ParserResult convertInto( std::string const& source,
                                      bool& target ) {
                std::string srcLC = toLower( source );

                if ( srcLC == "y" || srcLC == "1" || srcLC == "true" ||
                     srcLC == "yes" || srcLC == "on" ) {
                    target = true;
                } else if ( srcLC == "n" || srcLC == "0" || srcLC == "false" ||
                            srcLC == "no" || srcLC == "off" ) {
                    target = false;
                } else {
                    return ParserResult::runtimeError(
                        "Expected a boolean value but did not recognise: '" +
                        source + '\'' );
                }
                return ParserResult::ok( ParseResultType::Matched );
            }